

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O3

string * __thiscall
MinVR::VRDataIndex::addData(string *__return_storage_ptr__,VRDataIndex *this,string *keyAndValue)

{
  bool bVar1;
  long lVar2;
  VRError *this_00;
  VRDataIndex *this_01;
  string key;
  string value;
  VRCORETYPE_ID type;
  int local_114;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 local_70 [32];
  string local_50;
  
  lVar2 = std::__cxx11::string::find((char *)keyAndValue,0x15d57d,0);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)&local_110,(ulong)keyAndValue);
    std::__cxx11::string::substr((ulong)&local_f0,(ulong)keyAndValue);
    local_70._0_8_ = (VRDataIndex *)(local_70 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"/","");
    bVar1 = exists(this,&local_110,(string *)local_70,true);
    this_01 = (VRDataIndex *)local_70._0_8_;
    if ((VRDataIndex *)local_70._0_8_ != (VRDataIndex *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
    if (bVar1) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
      local_d0._M_dataplus._M_p._0_4_ = getType(this,&local_110,&local_90,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_d0._M_dataplus._M_p._0_4_ = _inferType(this_01,&local_f0);
    }
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_f0._M_dataplus._M_p,
               local_f0._M_dataplus._M_p + local_f0._M_string_length);
    _processValue(__return_storage_ptr__,this,&local_110,(VRCORETYPE_ID *)&local_d0,&local_b0,',');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (VRError *)__cxa_allocate_exception(0xa8);
  std::operator+(&local_110,"MinVR Error: Expected a key=value format for the string: ",keyAndValue)
  ;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.cpp"
             ,"");
  local_114 = 0x498;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"std::string MinVR::VRDataIndex::addData(const std::string &)","");
  VRError::VRError(this_00,&local_110,&local_f0,&local_d0,&local_114,&local_50);
  __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
}

Assistant:

std::string VRDataIndex::addData(const std::string &keyAndValue) {

  size_t poseql = keyAndValue.find("=");
  if (poseql == std::string::npos) {
    VRERRORNOADV("MinVR Error: Expected a key=value format for the string: " +
                 keyAndValue);
  }
  std::string key = keyAndValue.substr(0,poseql);
  std::string value = keyAndValue.substr(poseql+1);

  //  std::cout << "MinVR: Setting config value: " << key << "=" << value << std::endl;

  // If the key already exists, then match the existing type, otherwise infer
  // the type as usual.
  VRCORETYPE_ID type;
  if (exists(key, "/")) {
    type = getType(key);

  } else {

    type = _inferType(value);
  }

  // Got the name, type, value.  Go ahead and insert it into the index.
  return _processValue(key, type, value, MINVRSEPARATOR);
}